

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::json_value::json_value(json_value *this,value_t t)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  undefined3 in_register_00000031;
  
  switch(CONCAT31(in_register_00000031,t)) {
  default:
    *(undefined8 *)this = 0;
    return;
  case 1:
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x30)
    ;
    (pbVar1->_M_dataplus)._M_p = (pointer)0x0;
    pbVar1->_M_string_length = 0;
    (pbVar1->field_2)._M_allocated_capacity = 0;
    *(size_type **)((long)&pbVar1->field_2 + 8) = &pbVar1->_M_string_length;
    pbVar1[1]._M_dataplus._M_p = (pointer)&pbVar1->_M_string_length;
    pbVar1[1]._M_string_length = 0;
    break;
  case 2:
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x18)
    ;
    (pbVar1->_M_dataplus)._M_p = (pointer)0x0;
    pbVar1->_M_string_length = 0;
    (pbVar1->field_2)._M_allocated_capacity = 0;
    break;
  case 3:
    pbVar1 = basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::create<std::__cxx11::string,char_const(&)[1]>((char (*) [1])"");
    break;
  case 4:
    *this = (json_value)0x0;
    return;
  }
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this = pbVar1;
  return;
}

Assistant:

json_value(value_t t) {
			switch (t) {
				case value_t::object: {
					object = create<object_t>();
					break;
				}

				case value_t::array: {
					array = create<array_t>();
					break;
				}

				case value_t::string: {
					string = create<string_t>("");
					break;
				}

				case value_t::boolean: {
					boolean = boolean_t(false);
					break;
				}

				case value_t::number_integer: {
					number_integer = number_integer_t(0);
					break;
				}

				case value_t::number_unsigned: {
					number_unsigned = number_unsigned_t(0);
					break;
				}

				case value_t::number_float: {
					number_float = number_float_t(0.0);
					break;
				}

				case value_t::null: {
					object = nullptr;  // silence warning, see #821
					break;
				}

				default: {
					object = nullptr;  // silence warning, see #821
					if (JSON_UNLIKELY(t == value_t::null)) {
						JSON_THROW(other_error::create(
							500, "961c151d2e87f2686a955a9be24d316f1362bf21 3.4.0"));  // LCOV_EXCL_LINE
					}
					break;
				}
			}
		}